

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

long duckdb::QuantileContFun::GetFunctions(void)

{
  long in_RDI;
  pointer pLVar1;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_630;
  long local_618;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *local_610;
  LogicalType local_608 [24];
  LogicalType *local_5f0;
  LogicalType local_5e8 [24];
  LogicalType local_5d0 [24];
  LogicalType local_5b8 [24];
  LogicalType local_5a0 [24];
  LogicalType local_588 [24];
  LogicalType local_570 [24];
  LogicalType local_558 [24];
  string local_540 [32];
  LogicalType local_520 [24];
  LogicalType local_508 [24];
  AggregateFunction local_4f0;
  AggregateFunction local_3c0;
  AggregateFunction local_290;
  AggregateFunction local_160;
  
  std::__cxx11::string::string(local_540,"quantile_cont",(allocator *)&local_630);
  local_618 = in_RDI;
  duckdb::AggregateFunctionSet::AggregateFunctionSet();
  std::__cxx11::string::~string(local_540);
  duckdb::LogicalType::LogicalType(local_558,DECIMAL);
  duckdb::LogicalType::LogicalType(local_570,DECIMAL);
  duckdb::LogicalType::LogicalType((LogicalType *)&local_630,DOUBLE);
  EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
            (&local_3c0,local_558,local_570,(LogicalType *)&local_630);
  local_610 = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
              (local_618 + 0x20);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(local_610,&local_3c0);
  AggregateFunction::~AggregateFunction(&local_3c0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_630);
  duckdb::LogicalType::~LogicalType(local_570);
  duckdb::LogicalType::~LogicalType(local_558);
  duckdb::LogicalType::LogicalType(local_588,DECIMAL);
  duckdb::LogicalType::LogicalType(local_5a0,DECIMAL);
  duckdb::LogicalType::LogicalType(local_608,DOUBLE);
  duckdb::LogicalType::LIST((LogicalType *)&local_630);
  EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
            (&local_4f0,local_588,local_5a0,(LogicalType *)&local_630);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(local_610,&local_4f0);
  AggregateFunction::~AggregateFunction(&local_4f0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&local_630);
  duckdb::LogicalType::~LogicalType(local_608);
  duckdb::LogicalType::~LogicalType(local_5a0);
  duckdb::LogicalType::~LogicalType(local_588);
  GetContinuousQuantileTypes();
  local_5f0 = local_630.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  for (pLVar1 = local_630.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start; pLVar1 != local_5f0;
      pLVar1 = pLVar1 + 0x18) {
    duckdb::LogicalType::LogicalType(local_5b8,pLVar1);
    duckdb::LogicalType::LogicalType(local_5d0,pLVar1);
    duckdb::LogicalType::LogicalType(local_608,DOUBLE);
    EmptyQuantileFunction<duckdb::ContinuousQuantileFunction>
              (&local_160,local_5b8,local_5d0,local_608);
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>(local_610,&local_160);
    AggregateFunction::~AggregateFunction(&local_160);
    duckdb::LogicalType::~LogicalType(local_608);
    duckdb::LogicalType::~LogicalType(local_5d0);
    duckdb::LogicalType::~LogicalType(local_5b8);
    duckdb::LogicalType::LogicalType(local_5e8,pLVar1);
    duckdb::LogicalType::LogicalType(local_508,pLVar1);
    duckdb::LogicalType::LogicalType(local_520,DOUBLE);
    duckdb::LogicalType::LIST(local_608);
    EmptyQuantileFunction<duckdb::ContinuousQuantileListFunction>
              (&local_290,local_5e8,local_508,local_608);
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>(local_610,&local_290);
    AggregateFunction::~AggregateFunction(&local_290);
    duckdb::LogicalType::~LogicalType(local_608);
    duckdb::LogicalType::~LogicalType(local_520);
    duckdb::LogicalType::~LogicalType(local_508);
    duckdb::LogicalType::~LogicalType(local_5e8);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_630);
  return local_618;
}

Assistant:

AggregateFunctionSet QuantileContFun::GetFunctions() {
	AggregateFunctionSet quantile_cont("quantile_cont");
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::DOUBLE));
	quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileListFunction>(
	    LogicalTypeId::DECIMAL, LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::DOUBLE)));
	for (const auto &type : GetContinuousQuantileTypes()) {
		quantile_cont.AddFunction(EmptyQuantileFunction<ContinuousQuantileFunction>(type, type, LogicalType::DOUBLE));
		quantile_cont.AddFunction(
		    EmptyQuantileFunction<ContinuousQuantileListFunction>(type, type, LogicalType::LIST(LogicalType::DOUBLE)));
	}
	return quantile_cont;
}